

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O2

uint Imf_3_4::anon_unknown_6::roundListSizeUp(uint n)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if (n != 0) {
    uVar2 = 1;
    do {
      uVar1 = uVar2;
      bVar3 = uVar2 < n;
      uVar2 = uVar2 * 2;
    } while (bVar3);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned int
roundListSizeUp (unsigned int n)
{
    //
    // Calculate the number of samples to be allocated for a sample list
    // with n entries by rounding n up to the next power of two.
    //

    if (n == 0) return 0;

    unsigned int s = 1;

    while (s < n)
        s <<= 1;

    return s;
}